

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF.cc
# Opt level: O2

QPDFObjectHandle __thiscall
QPDF::replaceForeignIndirectObjects
          (QPDF *this,QPDFObjectHandle *foreign,ObjCopier *obj_copier,bool top)

{
  bool bVar1;
  qpdf_object_type_e qVar2;
  iterator iVar3;
  iterator iVar4;
  iterator iVar5;
  iterator iVar6;
  iterator iVar7;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *p_Var8;
  logic_error *this_00;
  undefined7 in_register_00000009;
  _Rb_tree<QPDFObjGen,_std::pair<const_QPDFObjGen,_QPDFObjectHandle>,_std::_Select1st<std::pair<const_QPDFObjGen,_QPDFObjectHandle>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFObjectHandle>_>_>
  *this_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var9;
  int in_R8D;
  QPDFObjectHandle QVar10;
  QPDFObjectHandle dict;
  QPDFObjectHandle old_dict;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_a0;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_90;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_80;
  undefined1 local_70 [16];
  QPDFObjectHandle local_60;
  undefined1 local_50 [16];
  undefined1 local_40 [16];
  
  this_01 = (_Rb_tree<QPDFObjGen,_std::pair<const_QPDFObjGen,_QPDFObjectHandle>,_std::_Select1st<std::pair<const_QPDFObjGen,_QPDFObjectHandle>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFObjectHandle>_>_>
             *)CONCAT71(in_register_00000009,top);
  qVar2 = QPDFObjectHandle::getTypeCode((QPDFObjectHandle *)obj_copier);
  (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
  super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
  super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl = (Members *)0x0;
  this[1].m._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
  super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
  super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl = (Members *)0x0;
  if ((in_R8D == 0) && (bVar1 = QPDFObjectHandle::isIndirect((QPDFObjectHandle *)obj_copier), bVar1)
     ) {
    dict.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)QPDFObjectHandle::getObjGen((QPDFObjectHandle *)obj_copier);
    iVar3 = std::
            _Rb_tree<QPDFObjGen,_std::pair<const_QPDFObjGen,_QPDFObjectHandle>,_std::_Select1st<std::pair<const_QPDFObjGen,_QPDFObjectHandle>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFObjectHandle>_>_>
            ::find(this_01,(key_type *)&dict);
    if ((_Rb_tree_header *)iVar3._M_node == &(this_01->_M_impl).super__Rb_tree_header) {
      QPDFObjectHandle::newNull();
      std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)this,
                 (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&dict);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&dict.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      _Var9._M_pi = extraout_RDX_05;
    }
    else {
      std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)this,
                 (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&iVar3._M_node[1]._M_parent
                );
      _Var9._M_pi = extraout_RDX;
    }
    goto LAB_00135535;
  }
  if (qVar2 == ot_stream) {
    dict.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)QPDFObjectHandle::getObjGen((QPDFObjectHandle *)obj_copier);
    p_Var8 = (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
             std::
             map<QPDFObjGen,_QPDFObjectHandle,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFObjectHandle>_>_>
             ::operator[]((map<QPDFObjGen,_QPDFObjectHandle,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFObjectHandle>_>_>
                           *)this_01,(key_type *)&dict);
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)this,p_Var8);
    QPDFObjectHandle::getDict(&dict);
    QPDFObjectHandle::getDict(&old_dict);
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_a0,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&old_dict);
    iVar6 = ::qpdf::BaseDictionary::begin_abi_cxx11_((BaseDictionary *)&local_a0);
    iVar7 = ::qpdf::BaseDictionary::end_abi_cxx11_((BaseDictionary *)&local_a0);
    for (; iVar6._M_node != iVar7._M_node;
        iVar6._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar6._M_node)) {
      bVar1 = ::qpdf::BaseHandle::null((BaseHandle *)(iVar6._M_node + 2));
      if (!bVar1) {
        std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)local_70,
                   (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)(iVar6._M_node + 2));
        replaceForeignIndirectObjects((QPDF *)&local_60,foreign,(ObjCopier *)local_70,top);
        QPDFObjectHandle::replaceKey(&dict,(string *)(iVar6._M_node + 1),&local_60);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_60.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_70 + 8));
      }
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a0._M_refcount);
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_80,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)this);
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_90,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)obj_copier);
    copyStreamData((QPDF *)foreign,(QPDFObjectHandle *)&local_80,(QPDFObjectHandle *)&local_90);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_90._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&old_dict.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
LAB_001354b0:
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&dict.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    _Var9._M_pi = extraout_RDX_02;
  }
  else {
    if (qVar2 == ot_dictionary) {
      QPDFObjectHandle::newDictionary();
      std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)this,
                 (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&dict);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&dict.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&dict,
                 (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)obj_copier);
      iVar6 = ::qpdf::BaseDictionary::begin_abi_cxx11_((BaseDictionary *)&dict);
      iVar7 = ::qpdf::BaseDictionary::end_abi_cxx11_((BaseDictionary *)&dict);
      for (; iVar6._M_node != iVar7._M_node;
          iVar6._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar6._M_node)) {
        bVar1 = ::qpdf::BaseHandle::null((BaseHandle *)(iVar6._M_node + 2));
        if (!bVar1) {
          std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)local_50,
                     (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)(iVar6._M_node + 2));
          replaceForeignIndirectObjects((QPDF *)&old_dict,foreign,(ObjCopier *)local_50,top);
          QPDFObjectHandle::replaceKey
                    ((QPDFObjectHandle *)this,(string *)(iVar6._M_node + 1),&old_dict);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&old_dict.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_50 + 8));
        }
      }
      goto LAB_001354b0;
    }
    if (qVar2 == ot_array) {
      QPDFObjectHandle::newArray();
      std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)this,
                 (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&dict);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&dict.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      ::qpdf::Array::Array((Array *)&dict,(shared_ptr<QPDFObject> *)obj_copier);
      iVar4 = ::qpdf::Array::begin((Array *)&dict);
      iVar5 = ::qpdf::Array::end((Array *)&dict);
      for (; iVar4._M_current != iVar5._M_current;
          iVar4._M_current =
               (QPDFObjectHandle *)
               ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)iVar4._M_current + 1)) {
        std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)local_40,
                   (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)iVar4._M_current);
        replaceForeignIndirectObjects((QPDF *)&old_dict,foreign,(ObjCopier *)local_40,top);
        QPDFObjectHandle::appendItem((QPDFObjectHandle *)this,&old_dict);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&old_dict.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_40 + 8));
      }
      ::qpdf::Array::~Array((Array *)&dict);
      _Var9._M_pi = extraout_RDX_01;
    }
    else {
      QPDFObjectHandle::assertScalar((QPDFObjectHandle *)obj_copier);
      std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)this,
                 (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)obj_copier);
      QPDFObjectHandle::makeDirect((QPDFObjectHandle *)this,false);
      _Var9._M_pi = extraout_RDX_00;
    }
  }
  if ((((char)in_R8D != '\0') &&
      (bVar1 = QPDFObjectHandle::isStream((QPDFObjectHandle *)this), _Var9._M_pi = extraout_RDX_03,
      !bVar1)) &&
     (bVar1 = QPDFObjectHandle::isIndirect((QPDFObjectHandle *)this), _Var9._M_pi = extraout_RDX_04,
     bVar1)) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"replacement for foreign object is indirect");
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
LAB_00135535:
  QVar10.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = _Var9._M_pi;
  QVar10.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (QPDFObjectHandle)
         QVar10.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QPDFObjectHandle
QPDF::replaceForeignIndirectObjects(QPDFObjectHandle foreign, ObjCopier& obj_copier, bool top)
{
    auto foreign_tc = foreign.getTypeCode();
    QPDFObjectHandle result;
    if ((!top) && foreign.isIndirect()) {
        QTC::TC("qpdf", "QPDF replace indirect");
        auto mapping = obj_copier.object_map.find(foreign.getObjGen());
        if (mapping == obj_copier.object_map.end()) {
            // This case would occur if this is a reference to a Pages object that we didn't
            // traverse into.
            QTC::TC("qpdf", "QPDF replace foreign indirect with null");
            result = QPDFObjectHandle::newNull();
        } else {
            result = mapping->second;
        }
    } else if (foreign_tc == ::ot_array) {
        QTC::TC("qpdf", "QPDF replace array");
        result = QPDFObjectHandle::newArray();
        for (auto const& item: foreign.as_array()) {
            result.appendItem(replaceForeignIndirectObjects(item, obj_copier, false));
        }
    } else if (foreign_tc == ::ot_dictionary) {
        QTC::TC("qpdf", "QPDF replace dictionary");
        result = QPDFObjectHandle::newDictionary();
        for (auto const& [key, value]: foreign.as_dictionary()) {
            if (!value.null()) {
                result.replaceKey(key, replaceForeignIndirectObjects(value, obj_copier, false));
            }
        }
    } else if (foreign_tc == ::ot_stream) {
        QTC::TC("qpdf", "QPDF replace stream");
        result = obj_copier.object_map[foreign.getObjGen()];
        QPDFObjectHandle dict = result.getDict();
        QPDFObjectHandle old_dict = foreign.getDict();
        for (auto const& [key, value]: old_dict.as_dictionary()) {
            if (!value.null()) {
                dict.replaceKey(key, replaceForeignIndirectObjects(value, obj_copier, false));
            }
        }
        copyStreamData(result, foreign);
    } else {
        foreign.assertScalar();
        result = foreign;
        result.makeDirect();
    }

    if (top && (!result.isStream()) && result.isIndirect()) {
        throw std::logic_error("replacement for foreign object is indirect");
    }

    return result;
}